

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O2

void render_memory_region
               (FlatView *view,MemoryRegion_conflict *mr,Int128 base,AddrRange clip,_Bool readonly)

{
  _Bool _Var1;
  FlatRange *pFVar2;
  ulong uVar3;
  long lVar4;
  undefined1 base_00 [16];
  undefined1 a [16];
  undefined1 a_00 [16];
  undefined1 a_01 [16];
  undefined1 a_02 [16];
  undefined1 a_03 [16];
  undefined1 b [16];
  undefined1 b_00 [16];
  AddrRange clip_00;
  AddrRange r1;
  AddrRange r1_00;
  AddrRange r2;
  AddrRange r2_00;
  _Bool _Var5;
  MemoryRegion *pMVar6;
  long in_RCX;
  _Bool *p_Var7;
  long lVar8;
  undefined7 in_register_00000011;
  long extraout_RDX;
  long extraout_RDX_00;
  uint uVar9;
  _Bool *p_Var10;
  byte in_R8B;
  MemoryRegion *__return_storage_ptr__;
  _Bool *p_Var11;
  anon_union_16_2_aaf24f3d_for_subregions_link *paVar12;
  MemoryRegion *pMVar13;
  long lVar14;
  _Bool *p_Var15;
  MemoryRegion *pMVar16;
  bool bVar17;
  AddrRange tmp;
  FlatRange fr;
  MemoryRegion *pMVar18;
  MemoryRegion *pMVar19;
  _Bool *p_Var20;
  undefined8 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  undefined8 in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  undefined1 local_78 [24];
  _Bool *p_Stack_60;
  MemoryRegion *local_58;
  _Bool *local_50;
  _Bool local_48;
  
  if (mr->enabled == true) {
    pMVar16 = (MemoryRegion *)(CONCAT71(in_register_00000011,readonly) + mr->addr);
    p_Var15 = (_Bool *)(in_RCX + (ulong)CARRY8(CONCAT71(in_register_00000011,readonly),mr->addr));
    _Var1 = mr->readonly;
    pMVar19 = *(MemoryRegion **)&mr->size;
    p_Var20 = *(_Bool **)((long)&mr->size + 8);
    r1_00.start._8_8_ = (undefined8)clip.start;
    r1_00.start._0_8_ = base._8_8_;
    r1_00.size._0_8_ = clip.start._8_8_;
    r1_00.size._8_8_ = in_stack_ffffffffffffff28;
    r2_00.start._4_4_ = in_stack_ffffffffffffff34;
    r2_00.start._0_4_ = in_stack_ffffffffffffff30;
    r2_00.start._8_8_ = in_stack_ffffffffffffff38;
    r2_00.size._0_8_ = in_stack_ffffffffffffff40;
    r2_00.size._8_8_ = in_stack_ffffffffffffff48;
    _Var5 = addrrange_intersects(r1_00,r2_00);
    if (_Var5) {
      r1.start._8_8_ = (undefined8)base;
      r1.start._0_8_ = p_Var20;
      r1.size._0_8_ = base._8_8_;
      r1.size._8_8_ = (undefined8)clip.start;
      r2.start._8_8_ = in_stack_ffffffffffffff28;
      r2.start._0_8_ = clip.start._8_8_;
      r2.size._0_4_ = in_stack_ffffffffffffff30;
      r2.size._4_4_ = in_stack_ffffffffffffff34;
      r2.size._8_8_ = in_stack_ffffffffffffff38;
      pMVar18 = pMVar16;
      addrrange_intersection(r1,r2);
      p_Var11 = p_Stack_60;
      __return_storage_ptr__ = (MemoryRegion *)local_78._16_8_;
      p_Var10 = (_Bool *)local_78._8_8_;
      paVar12 = (anon_union_16_2_aaf24f3d_for_subregions_link *)&mr->subregions;
      uVar9 = (uint)(in_R8B | _Var1);
      while( true ) {
        pMVar6 = paVar12->tqe_next;
        if (pMVar6 == (MemoryRegion *)0x0) break;
        base_00._8_8_ = p_Var10;
        base_00._0_8_ = local_78._0_8_;
        clip_00.start._8_8_ = p_Var11;
        clip_00.start._0_8_ = __return_storage_ptr__;
        clip_00.size._0_8_ = (long)base;
        clip_00.size._8_8_ = SUB168(base,8);
        pMVar18 = (MemoryRegion *)local_78._0_8_;
        p_Var15 = p_Var10;
        pMVar19 = __return_storage_ptr__;
        p_Var20 = p_Var11;
        render_memory_region
                  (view,(MemoryRegion_conflict *)pMVar6,(Int128)base_00,clip_00,SUB81(pMVar16,0));
        paVar12 = &pMVar6->subregions_link;
      }
      if (((MemoryRegion *)mr)->terminates == true) {
        p_Var7 = (_Bool *)(local_78._0_8_ - (long)pMVar16);
        a._8_8_ = p_Var15;
        a._0_8_ = pMVar18;
        int128_get64((Int128)a);
        local_48 = SUB41(uVar9,0);
        pMVar16 = (MemoryRegion *)local_78._0_8_;
        local_78._0_8_ = mr;
        for (uVar9 = 0; uVar9 < view->nr; uVar9 = uVar9 + 1) {
          if (__return_storage_ptr__ == (MemoryRegion *)0x0 && p_Var11 == (_Bool *)0x0) {
            return;
          }
          pFVar2 = view->ranges;
          pMVar6 = *(MemoryRegion **)&pFVar2[uVar9].addr.start;
          lVar14 = *(long *)((long)&pFVar2[uVar9].addr.start + 8);
          uVar3 = (ulong)pFVar2[uVar9].addr.size;
          lVar8 = *(long *)((long)&pFVar2[uVar9].addr.size + 8) + lVar14 +
                  (ulong)CARRY8(uVar3,(ulong)pMVar6);
          uVar3 = (ulong)(pMVar16 < (MemoryRegion *)(&pMVar6->ram + uVar3));
          lVar4 = (long)p_Var10 - lVar8;
          if ((SBORROW8((long)p_Var10,lVar8) != SBORROW8(lVar4,uVar3)) != (long)(lVar4 - uVar3) < 0)
          {
            if ((SBORROW8((long)p_Var10,lVar14) !=
                SBORROW8((long)p_Var10 - lVar14,(ulong)(pMVar16 < pMVar6))) !=
                (long)(((long)p_Var10 - lVar14) - (ulong)(pMVar16 < pMVar6)) < 0) {
              a_00._8_8_ = p_Var15;
              a_00._0_8_ = pMVar18;
              b._8_8_ = p_Var20;
              b._0_8_ = pMVar19;
              pMVar6 = (MemoryRegion *)
                       int128_min((Int128 *)__return_storage_ptr__,(Int128)a_00,(Int128)b);
              local_78._8_8_ = p_Var7;
              local_78._16_8_ = pMVar16;
              p_Stack_60 = p_Var10;
              local_58 = pMVar6;
              flatview_insert(view,uVar9,(FlatRange *)local_78);
              uVar9 = uVar9 + 1;
              bVar17 = CARRY8((ulong)pMVar16,(ulong)pMVar6);
              pMVar16 = (MemoryRegion *)(&pMVar6->ram + (long)&pMVar16->ram);
              p_Var10 = p_Var10 + (ulong)bVar17 + extraout_RDX;
              a_01._8_8_ = p_Var15;
              a_01._0_8_ = pMVar18;
              int128_get64((Int128)a_01);
              p_Var7 = &pMVar6->ram + (long)p_Var7;
              bVar17 = __return_storage_ptr__ < pMVar6;
              __return_storage_ptr__ = (MemoryRegion *)((long)__return_storage_ptr__ - (long)pMVar6)
              ;
              p_Var11 = p_Var11 + (-(ulong)bVar17 - extraout_RDX);
            }
            a_02._8_8_ = p_Var15;
            a_02._0_8_ = pMVar18;
            b_00._8_8_ = p_Var20;
            b_00._0_8_ = pMVar19;
            pMVar6 = (MemoryRegion *)
                     int128_min((Int128 *)(&__return_storage_ptr__->ram + (long)&pMVar16->ram),
                                (Int128)a_02,(Int128)b_00);
            pMVar13 = (MemoryRegion *)((long)pMVar6 - (long)pMVar16);
            lVar14 = (extraout_RDX_00 - (ulong)(pMVar6 < pMVar16)) - (long)p_Var10;
            bVar17 = CARRY8((ulong)pMVar16,(ulong)pMVar13);
            pMVar16 = (MemoryRegion *)((long)pMVar16 + (long)pMVar13);
            p_Var10 = p_Var10 + (ulong)bVar17 + lVar14;
            a_03._8_8_ = p_Var15;
            a_03._0_8_ = pMVar18;
            int128_get64((Int128)a_03);
            p_Var7 = &pMVar13->ram + (long)p_Var7;
            bVar17 = __return_storage_ptr__ < pMVar13;
            __return_storage_ptr__ = (MemoryRegion *)((long)__return_storage_ptr__ - (long)pMVar13);
            p_Var11 = p_Var11 + (-(ulong)bVar17 - lVar14);
          }
        }
        if (__return_storage_ptr__ != (MemoryRegion *)0x0 || p_Var11 != (_Bool *)0x0) {
          local_78._8_8_ = p_Var7;
          local_78._16_8_ = pMVar16;
          p_Stack_60 = p_Var10;
          local_58 = __return_storage_ptr__;
          local_50 = p_Var11;
          flatview_insert(view,uVar9,(FlatRange *)local_78);
        }
      }
    }
  }
  return;
}

Assistant:

static void render_memory_region(FlatView *view,
                                 MemoryRegion *mr,
                                 Int128 base,
                                 AddrRange clip,
                                 bool readonly)
{
    MemoryRegion *subregion;
    unsigned i;
    hwaddr offset_in_region;
    Int128 remain;
    Int128 now;
    FlatRange fr;
    AddrRange tmp;

    if (!mr->enabled) {
        return;
    }

    int128_addto(&base, int128_make64(mr->addr));
    readonly |= mr->readonly;

    tmp = addrrange_make(base, mr->size);

    if (!addrrange_intersects(tmp, clip)) {
        return;
    }

    clip = addrrange_intersection(tmp, clip);

    /* Render subregions in priority order. */
    QTAILQ_FOREACH(subregion, &mr->subregions, subregions_link) {
        render_memory_region(view, subregion, base, clip, readonly);
    }

    if (!mr->terminates) {
        return;
    }

    offset_in_region = int128_get64(int128_sub(clip.start, base));
    base = clip.start;
    remain = clip.size;

    fr.mr = mr;
    fr.readonly = readonly;

    /* Render the region itself into any gaps left by the current view. */
    for (i = 0; i < view->nr && int128_nz(remain); ++i) {
        if (int128_ge(base, addrrange_end(view->ranges[i].addr))) {
            continue;
        }
        if (int128_lt(base, view->ranges[i].addr.start)) {
            now = int128_min(remain,
                             int128_sub(view->ranges[i].addr.start, base));
            fr.offset_in_region = offset_in_region;
            fr.addr = addrrange_make(base, now);
            flatview_insert(view, i, &fr);
            ++i;
            int128_addto(&base, now);
            offset_in_region += int128_get64(now);
            int128_subfrom(&remain, now);
        }
        now = int128_sub(int128_min(int128_add(base, remain),
                                    addrrange_end(view->ranges[i].addr)),
                         base);
        int128_addto(&base, now);
        offset_in_region += int128_get64(now);
        int128_subfrom(&remain, now);
    }
    if (int128_nz(remain)) {
        fr.offset_in_region = offset_in_region;
        fr.addr = addrrange_make(base, remain);
        flatview_insert(view, i, &fr);
    }
}